

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void Js::ScriptContext::RecyclerFunctionCallbackForDebugger(void *address,size_t size)

{
  ScriptContext *this;
  FunctionProxy *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  FunctionInfo *pFVar6;
  ScriptFunctionWithInlineCache *this_01;
  FunctionBody *this_02;
  ScriptFunction *scriptFunction;
  
  this = *(ScriptContext **)(*(long *)(*(long *)((long)address + 8) + 8) + 0x490);
  if (this != (ScriptContext *)0x0) {
    iVar3 = (*(this->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(this);
    if ((char)iVar3 != '\0') {
      return;
    }
    if (this->isEnumeratingRecyclerObjects != true) {
      return;
    }
    pFVar6 = *(FunctionInfo **)((long)address + 0x28);
    if (pFVar6 == (FunctionInfo *)JavascriptExternalFunction::EntryInfo::WrappedFunctionThunk) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x100e,
                                  "(pFunction->GetFunctionInfo() != &JavascriptExternalFunction::EntryInfo::WrappedFunctionThunk)"
                                  ,
                                  "pFunction->GetFunctionInfo() != &JavascriptExternalFunction::EntryInfo::WrappedFunctionThunk"
                                 );
      if (!bVar2) goto LAB_006f2112;
      *puVar5 = 0;
      pFVar6 = *(FunctionInfo **)((long)address + 0x28);
    }
    this_00 = (pFVar6->functionBodyImpl).ptr;
    if (this_00 == (FunctionProxy *)0x0) {
      BVar4 = JavascriptFunction::IsScriptFunction((JavascriptFunction *)address);
      if (BVar4 != 0) {
        return;
      }
      if (DAT_0143bfad != '\x01') {
        return;
      }
      bVar2 = IsScriptContextInDebugMode(this);
      if (!bVar2) {
        RestoreEntryPointFromProfileThunk((JavascriptFunction *)address);
        return;
      }
      SetEntryPointToProfileThunk((JavascriptFunction *)address);
      return;
    }
    if ((this_00->functionInfo).ptr != pFVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x1031,"(proxy->GetFunctionInfo() == info)",
                                  "proxy->GetFunctionInfo() == info");
      if (!bVar2) goto LAB_006f2112;
      *puVar5 = 0;
    }
    bVar2 = FunctionProxy::IsFunctionBody(this_00);
    if (bVar2) {
      BVar4 = JavascriptFunction::IsScriptFunction((JavascriptFunction *)address);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                    ,0x1038,"(pFunction->IsScriptFunction())",
                                    "pFunction->IsScriptFunction()");
        if (!bVar2) {
LAB_006f2112:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      if ((((this_00->m_utf8SourceInfo).ptr)->field_0xa8 & 4) == 0) {
        JavascriptFunction::ResetConstructorCacheToDefault((JavascriptFunction *)address);
      }
      bVar2 = VarIsImpl<Js::ScriptFunctionWithInlineCache>((RecyclableObject *)address);
      if (bVar2) {
        this_01 = VarTo<Js::ScriptFunctionWithInlineCache,Js::JavascriptFunction>
                            ((JavascriptFunction *)address);
        ScriptFunctionWithInlineCache::ClearInlineCacheOnFunctionObject(this_01);
      }
      this_02 = FunctionProxy::GetFunctionBody(this_00);
      bVar2 = IsScriptContextInDebugMode(this);
      if ((((bVar2) && ((((this_00->m_utf8SourceInfo).ptr)->field_0xa8 & 4) == 0)) &&
          (((this_02->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 8) == 0)) &&
         (bVar2 = FunctionProxy::IsInDebugMode((FunctionProxy *)this_02), !bVar2)) {
        Throw::FatalInternalError(-0x7fffbffb);
      }
      scriptFunction =
           VarTo<Js::ScriptFunction,Js::JavascriptFunction>((JavascriptFunction *)address);
      TransitionEnvironmentForDebugger(this,scriptFunction);
      return;
    }
  }
  return;
}

Assistant:

void ScriptContext::RecyclerFunctionCallbackForDebugger(void *address, size_t size)
    {
        JavascriptFunction *pFunction = (JavascriptFunction *)address;

        ScriptContext* scriptContext = pFunction->GetScriptContext();
        if (scriptContext == nullptr || scriptContext->IsClosed())
        {
            // Can't enumerate from closed scriptcontext
            return;
        }

        if (!scriptContext->IsEnumeratingRecyclerObjects())
        {
            return; // function not from enumerating script context
        }

        // Wrapped function are not allocated with the EnumClass bit
        Assert(pFunction->GetFunctionInfo() != &JavascriptExternalFunction::EntryInfo::WrappedFunctionThunk);

        FunctionInfo * info = pFunction->GetFunctionInfo();
        FunctionProxy * proxy = info->GetFunctionProxy();

        if (proxy == nullptr)
        {
            // Not a user defined function, we need to wrap them with try-catch for "continue after exception"
            if (!pFunction->IsScriptFunction() && IsExceptionWrapperForBuiltInsEnabled(scriptContext))
            {
#if defined(ENABLE_SCRIPT_DEBUGGING) || defined(ENABLE_SCRIPT_PROFILING)
                if (scriptContext->IsScriptContextInDebugMode())
                {
                    // We are attaching.
                    // For built-ins, WinRT and DOM functions which are already in recycler, change entry points to route to debug/profile thunk.
                    ScriptContext::SetEntryPointToProfileThunk(pFunction);
                }
                else
                {
                    // We are detaching.
                    // For built-ins, WinRT and DOM functions which are already in recycler, restore entry points to original.
                    if (!scriptContext->IsProfiling())
                    {
                        ScriptContext::RestoreEntryPointFromProfileThunk(pFunction);
                    }
                    // If we are profiling, don't change anything.
                }
#else
                AssertMsg(false, "Debugging/Profiling needs to be enabled to change thunks");
#endif
            }

            return;
        }

        Assert(proxy->GetFunctionInfo() == info);

        if (!proxy->IsFunctionBody())
        {
            // REVIEW: why we still have function that is still deferred?
            return;
        }
        Assert(pFunction->IsScriptFunction());

        // Excluding the internal library code, which is not debuggable already
        if (!proxy->GetUtf8SourceInfo()->GetIsLibraryCode())
        {
            // Reset the constructor cache to default, so that it will not pick up the cached type, created before debugging.
            // Look bug: 301517
            pFunction->ResetConstructorCacheToDefault();
        }

        if (VarIs<ScriptFunctionWithInlineCache>(pFunction))
        {
            VarTo<ScriptFunctionWithInlineCache>(pFunction)->ClearInlineCacheOnFunctionObject();
        }

        // We should have force parsed the function, and have a function body
        FunctionBody * pBody = proxy->GetFunctionBody();

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (scriptContext->IsScriptContextInDebugMode() &&
            !proxy->GetUtf8SourceInfo()->GetIsLibraryCode() &&
#ifdef ENABLE_WASM
            !pBody->IsWasmFunction() &&
#endif
            !pBody->IsInDebugMode())
        {
            // Identifying if any function escaped for not being in debug mode. (This can be removed as a part of TFS : 935011)
            Throw::FatalInternalError();
        }
#endif

#ifdef ASMJS_PLAT
        ScriptFunction * scriptFunction = VarTo<ScriptFunction>(pFunction);
        scriptContext->TransitionEnvironmentForDebugger(scriptFunction);
#endif
    }